

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O2

void __thiscall
amrex::FabArray<amrex::Mask>::FabArray(FabArray<amrex::Mask> *this,FabArray<amrex::Mask> *rhs)

{
  void *pvVar1;
  pointer ppMVar2;
  pointer pbVar3;
  Long LVar4;
  
  FabArrayBase::FabArrayBase(&this->super_FabArrayBase,&rhs->super_FabArrayBase);
  (this->super_FabArrayBase)._vptr_FabArrayBase = (_func_int **)&PTR__FabArray_006db8f0;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::Mask>,_std::default_delete<amrex::FabFactory<amrex::Mask>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::Mask>_*,_std::default_delete<amrex::FabFactory<amrex::Mask>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::Mask>_*,_false>._M_head_impl =
       (rhs->m_factory)._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::Mask>,_std::default_delete<amrex::FabFactory<amrex::Mask>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::Mask>_*,_std::default_delete<amrex::FabFactory<amrex::Mask>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::Mask>_*,_false>._M_head_impl;
  (rhs->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::Mask>,_std::default_delete<amrex::FabFactory<amrex::Mask>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::Mask>_*,_std::default_delete<amrex::FabFactory<amrex::Mask>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::Mask>_*,_false>._M_head_impl =
       (FabFactory<amrex::Mask> *)0x0;
  (this->m_dallocator).m_arena = (rhs->m_dallocator).m_arena;
  this->define_function_called = rhs->define_function_called;
  ppMVar2 = (rhs->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  (this->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (rhs->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppMVar2;
  (this->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (rhs->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (rhs->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (rhs->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar1 = rhs->m_hp_arrays;
  (rhs->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rhs->m_hp_arrays = (void *)0x0;
  this->m_hp_arrays = pvVar1;
  (this->m_arrays).hp = (rhs->m_arrays).hp;
  (this->m_const_arrays).hp = (rhs->m_const_arrays).hp;
  pbVar3 = (rhs->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (rhs->m_tags).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (rhs->m_tags).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (rhs->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rhs->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rhs->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shmem).alloc = (rhs->shmem).alloc;
  LVar4 = (rhs->shmem).n_points;
  (this->shmem).n_values = (rhs->shmem).n_values;
  (this->shmem).n_points = LVar4;
  (rhs->shmem).alloc = false;
  (this->fbd)._M_t.
  super___uniq_ptr_impl<amrex::FBData<amrex::Mask>,_std::default_delete<amrex::FBData<amrex::Mask>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FBData<amrex::Mask>_*,_std::default_delete<amrex::FBData<amrex::Mask>_>_>
  .super__Head_base<0UL,_amrex::FBData<amrex::Mask>_*,_false>._M_head_impl =
       (FBData<amrex::Mask> *)0x0;
  (this->pcd)._M_t.
  super___uniq_ptr_impl<amrex::PCData<amrex::Mask>,_std::default_delete<amrex::PCData<amrex::Mask>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::PCData<amrex::Mask>_*,_std::default_delete<amrex::PCData<amrex::Mask>_>_>
  .super__Head_base<0UL,_amrex::PCData<amrex::Mask>_*,_false>._M_head_impl =
       (PCData<amrex::Mask> *)0x0;
  (this->os_temp)._M_t.
  super___uniq_ptr_impl<amrex::FabArray<amrex::Mask>,_std::default_delete<amrex::FabArray<amrex::Mask>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabArray<amrex::Mask>_*,_std::default_delete<amrex::FabArray<amrex::Mask>_>_>
  .super__Head_base<0UL,_amrex::FabArray<amrex::Mask>_*,_false>._M_head_impl =
       (FabArray<amrex::Mask> *)0x0;
  FabArrayBase::FabArrayStats::recordBuild((FabArrayStats *)&FabArrayBase::m_FA_stats);
  rhs->define_function_called = false;
  ppMVar2 = (rhs->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((rhs->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppMVar2) {
    (rhs->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppMVar2;
  }
  clear(rhs);
  return;
}

Assistant:

FabArray<FAB>::FabArray (FabArray<FAB>&& rhs) noexcept
    : FabArrayBase (std::move(rhs))
    , m_factory    (std::move(rhs.m_factory))
    , m_dallocator (std::move(rhs.m_dallocator))
    , define_function_called(rhs.define_function_called)
    , m_fabs_v     (std::move(rhs.m_fabs_v))
#ifdef AMREX_USE_GPU
    , m_dp_arrays  (std::exchange(rhs.m_dp_arrays, nullptr))
#endif
    , m_hp_arrays  (std::exchange(rhs.m_hp_arrays, nullptr))
    , m_arrays     (rhs.m_arrays)
    , m_const_arrays(rhs.m_const_arrays)
    , m_tags       (std::move(rhs.m_tags))
    , shmem        (std::move(rhs.shmem))
    // no need to worry about the data used in non-blocking FillBoundary.
{
    m_FA_stats.recordBuild();
    rhs.define_function_called = false; // the responsibility of clear BD has been transferred.
    rhs.m_fabs_v.clear(); // clear the data pointers so that rhs.clear does delete them.
    rhs.clear();
}